

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

int xmlConvertSGMLCatalog(xmlCatalogPtr catal)

{
  int iVar1;
  xmlCatalogPtr catal_local;
  
  iVar1 = -1;
  if ((catal != (xmlCatalogPtr)0x0) && (catal->type == XML_SGML_CATALOG_TYPE)) {
    catal_local = catal;
    if (xmlDebugCatalogs != 0) {
      xmlCatalogPrintDebug("Converting SGML catalog to XML\n");
    }
    xmlHashScan(catal->sgml,xmlCatalogConvertEntry,&catal_local);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
xmlConvertSGMLCatalog(xmlCatalogPtr catal) {

    if ((catal == NULL) || (catal->type != XML_SGML_CATALOG_TYPE))
	return(-1);

    if (xmlDebugCatalogs) {
	xmlCatalogPrintDebug(
		"Converting SGML catalog to XML\n");
    }
    xmlHashScan(catal->sgml, xmlCatalogConvertEntry, &catal);
    return(0);
}